

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef lj_opt_cselim(jit_State *J,IRRef lim)

{
  ushort uVar1;
  TRef TVar2;
  uint local_20;
  IRRef2 op12;
  IRRef ref;
  IRRef lim_local;
  jit_State *J_local;
  
  uVar1 = J->chain[(J->fold).ins.field_1.o];
  while( true ) {
    local_20 = (uint)uVar1;
    if (local_20 <= lim) {
      TVar2 = lj_ir_emit(J);
      return TVar2;
    }
    if ((J->cur).ir[local_20].field_1.op12 ==
        (uint)(J->fold).ins.field_0.op1 + (uint)(J->fold).ins.field_0.op2 * 0x10000) break;
    uVar1 = *(ushort *)((long)(J->cur).ir + (ulong)local_20 * 8 + 6);
  }
  return local_20;
}

Assistant:

TRef LJ_FASTCALL lj_opt_cselim(jit_State *J, IRRef lim)
{
  IRRef ref = J->chain[fins->o];
  IRRef2 op12 = (IRRef2)fins->op1 + ((IRRef2)fins->op2 << 16);
  while (ref > lim) {
    if (IR(ref)->op12 == op12)
      return ref;
    ref = IR(ref)->prev;
  }
  return lj_ir_emit(J);
}